

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O2

int wally_addr_segwit_n_to_bytes
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              uchar *bytes_out,size_t len,size_t *written)

{
  char cVar1;
  size_t bytes_len;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  uint8_t *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uchar decoded [40];
  char local_e8 [96];
  uint8_t data [84];
  
  if (written == (size_t *)0x0) {
    return -2;
  }
  *written = 0;
  if (len == 0) {
    return -2;
  }
  if (bytes_out == (uchar *)0x0) {
    return -2;
  }
  if (addr_len < 8) {
    return -2;
  }
  if (addr == (char *)0x0) {
    return -2;
  }
  if (addr_family_len == 0) {
    return -2;
  }
  if (addr_family == (char *)0x0) {
    return -2;
  }
  if (flags != 0) {
    return -2;
  }
  if (0xffffffffffffffac < addr_len - 0x5b) {
    pcVar6 = addr + addr_len;
    uVar10 = 0;
    while ((pcVar6 = pcVar6 + -1, uVar11 = addr_len, addr_len != uVar10 &&
           (uVar11 = uVar10, *pcVar6 != '1'))) {
      uVar10 = uVar10 + 1;
    }
    lVar13 = addr_len - (uVar11 + 1);
    if (5 < uVar11 && (uVar11 + 1 <= addr_len && lVar13 != 0)) {
      uVar4 = 1;
      bVar2 = false;
      bVar3 = false;
      for (lVar12 = 0; lVar13 != lVar12; lVar12 = lVar12 + 1) {
        cVar1 = addr[lVar12];
        uVar9 = (uint)cVar1;
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_0012e50c;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar2 = true;
        }
        else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
          uVar9 = uVar9 | 0x20;
        }
        local_e8[lVar12] = (char)uVar9;
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = uVar9 >> 5 ^ uVar4;
      }
      local_e8[lVar13] = '\0';
      uVar4 = bech32_polymod_step(uVar4);
      for (lVar12 = 0; lVar13 != lVar12; lVar12 = lVar12 + 1) {
        uVar4 = bech32_polymod_step(uVar4);
        uVar4 = (byte)addr[lVar12] & 0x1f ^ uVar4;
      }
      puVar8 = data;
      for (uVar10 = addr_len - uVar11; uVar10 < addr_len; uVar10 = uVar10 + 1) {
        cVar1 = addr[uVar10];
        uVar9 = 0xffffffff;
        if (-1 < (long)cVar1) {
          uVar9 = (uint)charset_rev[cVar1];
        }
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar2 = true;
        }
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
        }
        if (uVar9 == 0xffffffff) goto LAB_0012e50c;
        uVar4 = bech32_polymod_step(uVar4);
        if (uVar10 + 6 < addr_len) {
          *puVar8 = (uint8_t)uVar9;
        }
        uVar4 = uVar4 ^ uVar9;
        puVar8 = puVar8 + 1;
      }
      if ((!bVar2) || (!bVar3)) {
        if ((uVar11 - 7 < 0x41) &&
           (((uVar4 == 1 || uVar4 == 0x2bc830a3 &&
             (sVar7 = strlen(local_e8), sVar7 == addr_family_len)) &&
            (iVar5 = bcmp(local_e8,addr_family,addr_family_len), iVar5 == 0)))) {
          if (data[0] == '\0') {
            if (uVar4 != 0x2bc830a3) goto LAB_0012e6f9;
          }
          else if (data[0] < 0x11 && uVar4 == 0x2bc830a3) {
LAB_0012e6f9:
            *written = 0;
            iVar5 = convert_bits(decoded,written,8,data + 1,uVar11 - 7,5,0);
            if (((iVar5 != 0) && (bytes_len = *written, 0xffffffffffffffd8 < bytes_len - 0x29)) &&
               ((data[0] != '\0' || ((bytes_len == 0x14 || (bytes_len == 0x20)))))) {
              iVar5 = wally_witness_program_from_bytes_and_version
                                (decoded,bytes_len,(uint)data[0],0,bytes_out,len,written);
              goto LAB_0012e533;
            }
          }
        }
      }
    }
  }
LAB_0012e50c:
  wally_clear_2(data,0x54,local_e8,0x54);
  *written = 0;
  iVar5 = -2;
LAB_0012e533:
  wally_clear(decoded,0x28);
  return iVar5;
}

Assistant:

int wally_addr_segwit_n_to_bytes(const char *addr, size_t addr_len,
                                 const char *addr_family, size_t addr_family_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char decoded[40];
    int ret;
    uint8_t witver;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr_family_len || !addr || addr_len < 8 || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr_family_len, addr, addr_len)) {
        *written = 0;
        ret = WALLY_EINVAL;
    } else {
        ret = wally_witness_program_from_bytes_and_version(
            decoded, *written, witver, flags, bytes_out, len, written);
    }

    wally_clear(decoded, sizeof(decoded));
    return ret;
}